

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::AdvancedPipelineComputeChain::GenGLSL_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int p)

{
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198;
  int local_1c;
  void *pvStack_18;
  int p_local;
  AdvancedPipelineComputeChain *this_local;
  
  local_1c = p;
  pvStack_18 = this;
  this_local = (AdvancedPipelineComputeChain *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  Common_abi_cxx11_(&local_1c8,this);
  std::operator<<(&local_198,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  if (local_1c == 0) {
    std::operator<<(&local_198,
                    "\nlayout(local_size_x = 4, local_size_y = 4, local_size_z = 4) in;\nvoid UpdateBuffer0(uvec3 id, int add_val) {\n  if (id.x < 8 && id.y < 8 && id.z < 8) {\n    g_buffer0.m1[id.z].m0[id.y].m0[id.x] += add_val;\n  }\n}\nuniform int g_add_value = 1;\nuniform uint g_counter_y = 1;\nuniform vec4 g_image_value = vec4(0.125, 0.25, 0.375, 0.5);\nvoid main() {\n  uvec3 id = gl_GlobalInvocationID;\n  UpdateBuffer0(id, 1);\n  UpdateBuffer0(id, g_add_value);\n  if (id == uvec3(1, g_counter_y, 1)) {\n    uint idx = atomicCounterIncrement(g_counter[1]);\n    g_buffer1.data[idx] = idx;\n    idx = atomicCounterIncrement(g_counter[1]);\n    g_buffer1.data[idx] = idx;\n  }\n  if (id.x < 4 && id.y < 4 && id.z == 0) {\n    vec4 v = imageLoad(g_image0, ivec2(id.xy));\n    imageStore(g_image0, ivec2(id.xy), v + g_image_value);\n  }\n  if (id.x < 2 && id.y == 0 && id.z == 0) {\n    g_buffer2.data[id.x] -= int(g_counter_y);\n  }\n}"
                   );
  }
  else if (local_1c == 1) {
    std::operator<<(&local_198,
                    "\nlayout(local_size_x = 4, local_size_y = 4, local_size_z = 1) in;\nuniform mat4 g_mvp = mat4(1.0, 0.0, 0.0, 0.0,  0.0, 1.0, 0.0, 0.0,  0.0, 0.0, 1.0, 0.0,  10.0, 20.0, 30.0, 1.0);\nvoid main() {\n  if (gl_GlobalInvocationID == uvec3(0)) {\n    g_buffer4.data0 *= g_mvp;\n  }\n  if (gl_WorkGroupID == uvec3(0)) {\n    g_buffer4.data1[gl_LocalInvocationID.y][gl_LocalInvocationID.x] = g_mvp[gl_LocalInvocationID.x][gl_LocalInvocationID.y];\n  }\n}"
                   );
  }
  else if (local_1c == 2) {
    std::operator<<(&local_198,
                    "\nlayout(local_size_x = 4, local_size_y = 4, local_size_z = 4) in;\nvoid main() {\n}"
                   );
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string GenGLSL(int p)
	{
		std::stringstream ss;
		ss << Common();
		if (p == 0)
		{
			ss << NL "layout(local_size_x = 4, local_size_y = 4, local_size_z = 4) in;" NL
					 "void UpdateBuffer0(uvec3 id, int add_val) {" NL "  if (id.x < 8 && id.y < 8 && id.z < 8) {" NL
					 "    g_buffer0.m1[id.z].m0[id.y].m0[id.x] += add_val;" NL "  }" NL "}" NL
					 "uniform int g_add_value = 1;" NL "uniform uint g_counter_y = 1;" NL
					 "uniform vec4 g_image_value = vec4(0.125, 0.25, 0.375, 0.5);" NL "void main() {" NL
					 "  uvec3 id = gl_GlobalInvocationID;" NL "  UpdateBuffer0(id, 1);" NL
					 "  UpdateBuffer0(id, g_add_value);" NL "  if (id == uvec3(1, g_counter_y, 1)) {" NL
					 "    uint idx = atomicCounterIncrement(g_counter[1]);" NL "    g_buffer1.data[idx] = idx;" NL
					 "    idx = atomicCounterIncrement(g_counter[1]);" NL "    g_buffer1.data[idx] = idx;" NL "  }" NL
					 "  if (id.x < 4 && id.y < 4 && id.z == 0) {" NL
					 "    vec4 v = imageLoad(g_image0, ivec2(id.xy));" NL
					 "    imageStore(g_image0, ivec2(id.xy), v + g_image_value);" NL "  }" NL
					 "  if (id.x < 2 && id.y == 0 && id.z == 0) {" NL "    g_buffer2.data[id.x] -= int(g_counter_y);" NL
					 "  }" NL "}";
		}
		else if (p == 1)
		{
			ss << NL "layout(local_size_x = 4, local_size_y = 4, local_size_z = 1) in;"
				// translation matrix
				NL "uniform mat4 g_mvp = mat4(1.0, 0.0, 0.0, 0.0,  0.0, 1.0, 0.0, 0.0,  0.0, 0.0, 1.0, 0.0,  10.0, "
					 "20.0, 30.0, 1.0);" NL "void main() {" NL "  if (gl_GlobalInvocationID == uvec3(0)) {" NL
					 "    g_buffer4.data0 *= g_mvp;" NL "  }" NL "  if (gl_WorkGroupID == uvec3(0)) {" NL
					 "    g_buffer4.data1[gl_LocalInvocationID.y][gl_LocalInvocationID.x] = "
					 "g_mvp[gl_LocalInvocationID.x][gl_LocalInvocationID.y];" NL "  }" NL "}";
		}
		else if (p == 2)
		{
			ss << NL "layout(local_size_x = 4, local_size_y = 4, local_size_z = 4) in;" NL "void main() {" NL "}";
		}
		return ss.str();
	}